

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::
SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<104u,Fixpp::Type::Char>>::Unparsed>::
emplace_back<int&,std::pair<char_const*,unsigned_long>>
          (SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<104u,Fixpp::Type::Char>>::Unparsed>
           *this,int *Args,pair<const_char_*,_unsigned_long> *Args_1)

{
  pair<const_char_*,_unsigned_long> *Args_local_1;
  int *Args_local;
  SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>::Unparsed>
  *this_local;
  
  if (*(ulong *)(this + 0x10) <= *(ulong *)(this + 8)) {
    SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>::Unparsed,_false>
    ::grow((SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>::Unparsed,_false>
            *)this,0);
  }
  Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>::Unparsed::Unparsed
            (*(Unparsed **)(this + 8),*Args,Args_1);
  SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>::Unparsed,_void>
  ::setEnd((SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>::Unparsed,_void>
            *)this,(Unparsed *)(*(long *)(this + 8) + 0x18));
  return;
}

Assistant:

void emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->EndX >= this->CapacityX))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->setEnd(this->end() + 1);
  }